

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

uint64_t bloaty::wasm::ReadLEB128Internal(bool is_signed,size_t size,string_view *data)

{
  byte bVar1;
  byte *pbVar2;
  size_type sVar3;
  const_pointer pvVar4;
  byte *pbVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  ulong in_RSI;
  byte in_DIL;
  char byte;
  char *limit;
  char *ptr;
  int maxshift;
  int shift;
  uint64_t ret;
  undefined8 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  byte *local_30;
  int local_24;
  ulong local_20;
  
  local_20 = 0;
  local_24 = 0;
  pbVar2 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDX);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDX);
  local_30 = pbVar2;
  do {
    if (local_30 >= pbVar2 + sVar3 || local_24 >= 0x46) {
      Throw((char *)CONCAT17(local_30 < pbVar2 + sVar3 && local_24 < 0x46,in_stack_ffffffffffffffb0)
            ,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    }
    pbVar5 = local_30 + 1;
    bVar1 = *local_30;
    local_20 = (long)(int)((int)(char)bVar1 & 0x7f) << ((byte)local_24 & 0x3f) | local_20;
    local_24 = local_24 + 7;
    local_30 = pbVar5;
  } while (((int)(char)bVar1 & 0x80U) != 0);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDX);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            (in_RDX,(long)pbVar5 - (long)pvVar4);
  if ((((in_DIL & 1) != 0) && ((ulong)(long)local_24 < in_RSI)) && ((bVar1 & 0x40) != 0)) {
    local_20 = -(1L << ((byte)local_24 & 0x3f)) | local_20;
  }
  return local_20;
}

Assistant:

uint64_t ReadLEB128Internal(bool is_signed, size_t size, string_view* data) {
  uint64_t ret = 0;
  int shift = 0;
  int maxshift = 70;
  const char* ptr = data->data();
  const char* limit = ptr + data->size();

  while (ptr < limit && shift < maxshift) {
    char byte = *(ptr++);
    ret |= static_cast<uint64_t>(byte & 0x7f) << shift;
    shift += 7;
    if ((byte & 0x80) == 0) {
      data->remove_prefix(ptr - data->data());
      if (is_signed && shift < size && (byte & 0x40)) {
        ret |= -(1ULL << shift);
      }
      return ret;
    }
  }

  THROW("corrupt wasm data, unterminated LEB128");
}